

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigopcount_tests.cpp
# Opt level: O1

void __thiscall sigopcount_tests::GetSigOpCount::test_method(GetSigOpCount *this)

{
  long lVar1;
  uint uVar2;
  pointer pCVar3;
  uint uVar4;
  size_type sVar5;
  CScript *pCVar6;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_00;
  int iVar7;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar8;
  undefined8 uVar9;
  iterator in_R8;
  iterator pvVar10;
  iterator in_R9;
  iterator pvVar11;
  pointer *__ptr;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  span<const_std::byte,_18446744073709551615UL> b;
  span<const_std::byte,_18446744073709551615UL> b_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  span<const_std::byte,_18446744073709551615UL> b_01;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  span<const_std::byte,_18446744073709551615UL> b_02;
  span<const_std::byte,_18446744073709551615UL> b_03;
  span<const_std::byte,_18446744073709551615UL> b_04;
  const_string file_09;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  undefined4 local_344;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sSerialized_1;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  uint local_29c;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  vector<CPubKey,_std::allocator<CPubKey>_> keys;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined4 *local_1a0;
  undefined1 local_198 [8];
  undefined4 **local_190;
  char *local_188;
  assertion_result local_180;
  CScript scriptSig2;
  CScript s2;
  CScript scriptSig;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sSerialized;
  uint160 dummy;
  uchar local_a4 [12];
  CScript p2sh;
  CScript s1;
  CKey k;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  s1.super_CScriptBase._union._16_8_ = 0;
  s1.super_CScriptBase._24_8_ = 0;
  s1.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  s1.super_CScriptBase._union._8_8_ = 0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x23;
  file.m_begin = (iterator)&local_1b0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1c0,msg);
  p2sh.super_CScriptBase._union.indirect_contents.capacity =
       p2sh.super_CScriptBase._union.indirect_contents.capacity & 0xffffff00;
  p2sh.super_CScriptBase._union.indirect_contents.indirect = "@;\x1f";
  p2sh.super_CScriptBase._union._16_4_ = 0x13c0138;
  p2sh.super_CScriptBase._union._20_4_ = 0;
  p2sh.super_CScriptBase._union._24_4_ = 0xf6cf21;
  p2sh.super_CScriptBase._size = 0;
  local_180._0_4_ = CScript::GetSigOpCount(&s1,false);
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect = (char *)&local_180;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&keys;
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_ << 0x20);
  scriptSig.super_CScriptBase._union.direct[0] = local_180._0_4_ == 0;
  scriptSig.super_CScriptBase._union._8_8_ = 0;
  scriptSig.super_CScriptBase._union._16_8_ = 0;
  s2.super_CScriptBase._union.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  s2.super_CScriptBase._union._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
       + 0x69;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)sSerialized.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "@;\x1f";
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  k.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._0_4_ =
       (uint)k.keydata._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl &
       0xffffff00;
  k._0_8_ = &PTR__lazy_ostream_013abbb0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scriptSig,(lazy_ostream *)&p2sh,1,2,REQUIRE,0xf3dfc3,(size_t)&s2,
             0x23,&sSerialized,"0U",&k);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&scriptSig.super_CScriptBase._union + 0x10));
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x24;
  file_00.m_begin = (iterator)&local_1d0;
  msg_00.m_end = pvVar11;
  msg_00.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1e0,
             msg_00);
  p2sh.super_CScriptBase._union.indirect_contents.capacity =
       p2sh.super_CScriptBase._union.indirect_contents.capacity & 0xffffff00;
  p2sh.super_CScriptBase._union.indirect_contents.indirect = "@;\x1f";
  p2sh.super_CScriptBase._union._16_4_ = 0x13c0138;
  p2sh.super_CScriptBase._union._20_4_ = 0;
  p2sh.super_CScriptBase._union._24_4_ = 0xf6cf21;
  p2sh.super_CScriptBase._size = 0;
  local_180._0_4_ = CScript::GetSigOpCount((CScript *)&s1.super_CScriptBase,true);
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                              super__Vector_impl_data._M_start & 0xffffffff00000000);
  scriptSig.super_CScriptBase._union.direct[0] = local_180._0_4_ == 0;
  scriptSig.super_CScriptBase._union._8_8_ = 0;
  scriptSig.super_CScriptBase._union._16_8_ = 0;
  s2.super_CScriptBase._union.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  s2.super_CScriptBase._union._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
       + 0x69;
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect = (char *)&local_180;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)sSerialized.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "@;\x1f";
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&keys;
  k.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._0_4_ =
       (uint)k.keydata._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl &
       0xffffff00;
  k._0_8_ = &PTR__lazy_ostream_013abbb0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scriptSig,(lazy_ostream *)&p2sh,1,2,REQUIRE,0xf3dfdb,(size_t)&s2,
             0x24,&sSerialized,"0U",&k);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&scriptSig.super_CScriptBase._union + 0x10));
  dummy.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  sVar5 = s1.super_CScriptBase._size - 0x1d;
  if (s1.super_CScriptBase._size < 0x1d) {
    sVar5 = s1.super_CScriptBase._size;
  }
  dummy.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  uVar9 = s1.super_CScriptBase._union.indirect_contents.indirect;
  if (s1.super_CScriptBase._size < 0x1d) {
    uVar9 = &s1.super_CScriptBase;
  }
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(sSerialized.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,0x51);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&s1.super_CScriptBase,
             (uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar9)->_union +
                      (long)(int)sVar5),(uchar *)&sSerialized);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&sSerialized,(uchar *)&dummy,
             local_a4,(allocator_type *)&k);
  b._M_extent._M_extent_value =
       (long)sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  b._M_ptr = sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  pCVar6 = CScript::operator<<(&s1,b);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&k,(uchar *)&dummy,local_a4,
             (allocator_type *)&p2sh);
  b_00._M_extent._M_extent_value =
       CONCAT44(k.keydata._M_t.
                super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._4_4_,
                (uint)k.keydata._M_t.
                      super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl)
       - k._0_8_;
  b_00._M_ptr = (pointer)k._0_8_;
  this_00 = &CScript::operator<<(pCVar6,b_00)->super_CScriptBase;
  uVar4 = this_00->_size;
  uVar2 = uVar4 - 0x1d;
  if (uVar4 < 0x1d) {
    uVar2 = uVar4;
  }
  ppVar8 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (this_00->_union).indirect_contents.indirect;
  if (uVar4 < 0x1d) {
    ppVar8 = this_00;
  }
  p2sh.super_CScriptBase._union.direct[0] = 0x52;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (this_00,(uchar *)((long)&ppVar8->_union + (long)(int)uVar2),(uchar *)&p2sh);
  uVar4 = this_00->_size;
  uVar2 = uVar4 - 0x1d;
  if (uVar4 < 0x1d) {
    uVar2 = uVar4;
  }
  ppVar8 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (this_00->_union).indirect_contents.indirect;
  if (uVar4 < 0x1d) {
    ppVar8 = this_00;
  }
  p2sh.super_CScriptBase._union.direct[0] = 0xae;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (this_00,(uchar *)((long)&ppVar8->_union + (long)(int)uVar2),(uchar *)&p2sh);
  if (k._0_8_ != 0) {
    operator_delete((void *)k._0_8_,(long)boost::unit_test::lazy_ostream::inst - k._0_8_);
  }
  if (sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)sSerialized.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)sSerialized.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = &DAT_00000028;
  file_01.m_begin = (iterator)&local_1f0;
  msg_01.m_end = pvVar11;
  msg_01.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_200,
             msg_01);
  p2sh.super_CScriptBase._union.indirect_contents.capacity =
       p2sh.super_CScriptBase._union.indirect_contents.capacity & 0xffffff00;
  p2sh.super_CScriptBase._union.indirect_contents.indirect = "@;\x1f";
  p2sh.super_CScriptBase._union._16_4_ = 0x13c0138;
  p2sh.super_CScriptBase._union._20_4_ = 0;
  p2sh.super_CScriptBase._union._24_4_ = 0xf6cf21;
  p2sh.super_CScriptBase._size = 0;
  uVar4 = CScript::GetSigOpCount((CScript *)&s1.super_CScriptBase,true);
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,2);
  scriptSig.super_CScriptBase._union.direct[0] = uVar4 == 2;
  scriptSig.super_CScriptBase._union._8_8_ = 0;
  scriptSig.super_CScriptBase._union._16_8_ = 0;
  s2.super_CScriptBase._union.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  s2.super_CScriptBase._union._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
       + 0x69;
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect = (char *)&local_180;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)sSerialized.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "@;\x1f";
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&keys;
  k.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._0_4_ =
       (uint)k.keydata._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl &
       0xffffff00;
  k._0_8_ = &PTR__lazy_ostream_013abbb0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_180._0_4_ = uVar4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scriptSig,(lazy_ostream *)&p2sh,1,2,REQUIRE,0xf3dfdb,(size_t)&s2,
             0x28,(vector<unsigned_char,std::allocator<unsigned_char>> *)&sSerialized,"2U",&k);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&scriptSig.super_CScriptBase._union + 0x10));
  uVar9 = s1.super_CScriptBase._union.indirect_contents.indirect;
  sVar5 = s1.super_CScriptBase._size - 0x1d;
  if (s1.super_CScriptBase._size < 0x1d) {
    uVar9 = &s1.super_CScriptBase;
    sVar5 = s1.super_CScriptBase._size;
  }
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(sSerialized.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,99);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&s1.super_CScriptBase,
             (uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar9)->_union +
                      (long)(int)sVar5),(uchar *)&sSerialized);
  uVar9 = s1.super_CScriptBase._union.indirect_contents.indirect;
  sVar5 = s1.super_CScriptBase._size - 0x1d;
  if (s1.super_CScriptBase._size < 0x1d) {
    uVar9 = &s1.super_CScriptBase;
    sVar5 = s1.super_CScriptBase._size;
  }
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(sSerialized.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,0xac);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&s1.super_CScriptBase,
             (uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar9)->_union +
                      (long)(int)sVar5),(uchar *)&sSerialized);
  uVar9 = s1.super_CScriptBase._union.indirect_contents.indirect;
  sVar5 = s1.super_CScriptBase._size - 0x1d;
  if (s1.super_CScriptBase._size < 0x1d) {
    uVar9 = &s1.super_CScriptBase;
    sVar5 = s1.super_CScriptBase._size;
  }
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(sSerialized.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,0x68);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&s1.super_CScriptBase,
             (uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar9)->_union +
                      (long)(int)sVar5),(uchar *)&sSerialized);
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x2a;
  file_02.m_begin = (iterator)&local_210;
  msg_02.m_end = pvVar11;
  msg_02.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_220,
             msg_02);
  p2sh.super_CScriptBase._union.indirect_contents.capacity =
       p2sh.super_CScriptBase._union.indirect_contents.capacity & 0xffffff00;
  p2sh.super_CScriptBase._union.indirect_contents.indirect = "@;\x1f";
  p2sh.super_CScriptBase._union._16_4_ = 0x13c0138;
  p2sh.super_CScriptBase._union._20_4_ = 0;
  p2sh.super_CScriptBase._union._24_4_ = 0xf6cf21;
  p2sh.super_CScriptBase._size = 0;
  local_180._0_4_ = CScript::GetSigOpCount(&s1,true);
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,3);
  scriptSig.super_CScriptBase._union.direct[0] = local_180._0_4_ == 3;
  scriptSig.super_CScriptBase._union._8_8_ = 0;
  scriptSig.super_CScriptBase._union._16_8_ = 0;
  s2.super_CScriptBase._union.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  s2.super_CScriptBase._union._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
       + 0x69;
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect = (char *)&local_180;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)sSerialized.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "@;\x1f";
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&keys;
  k.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._0_4_ =
       (uint)k.keydata._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl &
       0xffffff00;
  k._0_8_ = &PTR__lazy_ostream_013abbb0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scriptSig,(lazy_ostream *)&p2sh,1,2,REQUIRE,0xf3dfdb,(size_t)&s2,
             0x2a,&sSerialized,"3U",&k);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&scriptSig.super_CScriptBase._union + 0x10));
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x2b;
  file_03.m_begin = (iterator)&local_230;
  msg_03.m_end = pvVar11;
  msg_03.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_240,
             msg_03);
  p2sh.super_CScriptBase._union.indirect_contents.capacity =
       p2sh.super_CScriptBase._union.indirect_contents.capacity & 0xffffff00;
  p2sh.super_CScriptBase._union.indirect_contents.indirect = "@;\x1f";
  p2sh.super_CScriptBase._union._16_4_ = 0x13c0138;
  p2sh.super_CScriptBase._union._20_4_ = 0;
  p2sh.super_CScriptBase._union._24_4_ = 0xf6cf21;
  p2sh.super_CScriptBase._size = 0;
  local_180._0_4_ = CScript::GetSigOpCount(&s1,false);
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,0x15);
  scriptSig.super_CScriptBase._union.direct[0] = local_180._0_4_ == 0x15;
  scriptSig.super_CScriptBase._union._8_8_ = 0;
  scriptSig.super_CScriptBase._union._16_8_ = 0;
  s2.super_CScriptBase._union.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  s2.super_CScriptBase._union._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
       + 0x69;
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect = (char *)&local_180;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)sSerialized.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "@;\x1f";
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&keys;
  k.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._0_4_ =
       (uint)k.keydata._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl &
       0xffffff00;
  k._0_8_ = &PTR__lazy_ostream_013abbb0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scriptSig.super_CScriptBase,(lazy_ostream *)&p2sh,1,2,REQUIRE,
             0xf3dfc3,(size_t)&s2,0x2b,&sSerialized,"21U",&k);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&scriptSig.super_CScriptBase._union + 0x10));
  ScriptHash::ScriptHash((ScriptHash *)&k,&s1);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(sSerialized.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_,0x13c0138);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(k.keydata._M_t.
                         super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                         .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                         _M_head_impl._4_4_,
                         (uint)k.keydata._M_t.
                               super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                               .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                               _M_head_impl);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)k._0_8_;
  GetScriptForDestination(&p2sh,(CTxDestination *)&sSerialized);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&sSerialized);
  scriptSig.super_CScriptBase._union._16_8_ = 0;
  scriptSig.super_CScriptBase._24_8_ = 0;
  scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  scriptSig.super_CScriptBase._union._8_8_ = 0;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)sSerialized.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&scriptSig.super_CScriptBase,(iterator)&scriptSig.super_CScriptBase,
             (uchar *)&sSerialized);
  uVar9 = &s1;
  sVar5 = s1.super_CScriptBase._size;
  if (0x1c < s1.super_CScriptBase._size) {
    uVar9 = s1.super_CScriptBase._union.indirect_contents.indirect;
    sVar5 = s1.super_CScriptBase._size - 0x1d;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&sSerialized,
             (const_iterator)uVar9,(uchar *)(uVar9 + (long)(int)sVar5),(allocator_type *)&k);
  b_01._M_extent._M_extent_value =
       (long)sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  b_01._M_ptr = sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  CScript::operator<<(&scriptSig,b_01);
  if (sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)sSerialized.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)sSerialized.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x30;
  file_04.m_begin = (iterator)&local_250;
  msg_04.m_end = pvVar11;
  msg_04.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_260,
             msg_04);
  s2.super_CScriptBase._union._8_8_ = s2.super_CScriptBase._union._8_8_ & 0xffffffffffffff00;
  s2.super_CScriptBase._union.indirect_contents.indirect = "@;\x1f";
  s2.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  s2.super_CScriptBase._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  uVar4 = CScript::GetSigOpCount(&p2sh,&scriptSig);
  local_180._0_8_ = &local_190;
  local_190 = (undefined4 **)CONCAT44(local_190._4_4_,uVar4);
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_198;
  local_198._0_4_ = 3;
  scriptSig2.super_CScriptBase._union.direct[0] = uVar4 == 3;
  scriptSig2.super_CScriptBase._union._8_8_ = 0;
  scriptSig2.super_CScriptBase._union._16_8_ = 0;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)sSerialized.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "@;\x1f";
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  k.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._0_4_ =
       (uint)k.keydata._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl &
       0xffffff00;
  k._0_8_ = &PTR__lazy_ostream_013abbb0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scriptSig2,(lazy_ostream *)&s2,1,2,REQUIRE,0xf3dff2,
             (size_t)&sSerialized_1,0x30,
             (vector<unsigned_char,std::allocator<unsigned_char>> *)&sSerialized,"3U",&k);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&scriptSig2.super_CScriptBase._union + 0x10));
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar7 = 3;
  do {
    GenerateRandomKey(SUB81(&k,0));
    CKey::GetPubKey((CPubKey *)&sSerialized,&k);
    pCVar3 = keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<CPubKey,_std::allocator<CPubKey>_>::_M_realloc_insert<CPubKey>
                (&keys,(iterator)
                       keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                       super__Vector_impl_data._M_finish,(CPubKey *)&sSerialized);
    }
    else {
      memcpy(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_finish,(CPubKey *)&sSerialized,0x41);
      keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
      _M_finish = pCVar3 + 1;
    }
    if ((array<unsigned_char,_32UL> *)
        CONCAT44(k.keydata._M_t.
                 super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                 .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._4_4_
                 ,(uint)k.keydata._M_t.
                        super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                        _M_head_impl) != (array<unsigned_char,_32UL> *)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&k.keydata,
                 (array<unsigned_char,_32UL> *)
                 CONCAT44(k.keydata._M_t.
                          super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                          .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                          _M_head_impl._4_4_,
                          (uint)k.keydata._M_t.
                                super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                                .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                                _M_head_impl));
    }
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  GetScriptForMultisig(&s2,1,&keys);
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x39;
  file_05.m_begin = (iterator)&local_288;
  msg_05.m_end = pvVar11;
  msg_05.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_298,
             msg_05);
  scriptSig2.super_CScriptBase._union._8_8_ =
       scriptSig2.super_CScriptBase._union._8_8_ & 0xffffffffffffff00;
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect = "@;\x1f";
  scriptSig2.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  scriptSig2.super_CScriptBase._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1a0._0_4_ = CScript::GetSigOpCount(&s2,true);
  local_190 = &local_1a0;
  local_198 = (undefined1  [8])&local_29c;
  local_29c = 3;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(sSerialized_1.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,(uint)local_1a0 == 3);
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_180._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_180.m_message.px = (element_type *)0xf3dfb4;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)sSerialized.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "@;\x1f";
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  k.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._0_4_ =
       (uint)k.keydata._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl &
       0xffffff00;
  k._0_8_ = &PTR__lazy_ostream_013abbb0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sSerialized_1,(lazy_ostream *)&scriptSig2,1,2,REQUIRE,0xf3e010,
             (size_t)&local_180,0x39,(CPubKey *)&sSerialized,"3U",&k);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x3a;
  file_06.m_begin = (iterator)&local_2b0;
  msg_06.m_end = pvVar11;
  msg_06.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2c0,
             msg_06);
  scriptSig2.super_CScriptBase._union._8_8_ =
       scriptSig2.super_CScriptBase._union._8_8_ & 0xffffffffffffff00;
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect = "@;\x1f";
  scriptSig2.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  scriptSig2.super_CScriptBase._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  uVar4 = CScript::GetSigOpCount(&s2,false);
  local_1a0 = (undefined4 *)CONCAT44(local_1a0._4_4_,uVar4);
  local_29c = 0x14;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(sSerialized_1.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,uVar4 == 0x14);
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_180._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_180.m_message.px = (element_type *)0xf3dfb4;
  local_190 = &local_1a0;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)sSerialized.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "@;\x1f";
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_198 = (undefined1  [8])&local_29c;
  k.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._0_4_ =
       (uint)k.keydata._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl &
       0xffffff00;
  k._0_8_ = &PTR__lazy_ostream_013abbb0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sSerialized_1,(lazy_ostream *)&scriptSig2,1,2,REQUIRE,0xf3e027,
             (size_t)&local_180,0x3a,(CPubKey *)&sSerialized,"20U",&k);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  ScriptHash::ScriptHash((ScriptHash *)&scriptSig2,&s2);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(sSerialized.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_,
                         scriptSig2.super_CScriptBase._union._16_4_);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)scriptSig2.super_CScriptBase._union.indirect_contents.indirect;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)scriptSig2.super_CScriptBase._union._8_8_;
  GetScriptForDestination((CScript *)&k,(CTxDestination *)&sSerialized);
  if (0x1c < p2sh.super_CScriptBase._size) {
    free(p2sh.super_CScriptBase._union.indirect_contents.indirect);
  }
  p2sh.super_CScriptBase._union._16_4_ = 0x13c0138;
  p2sh.super_CScriptBase._union._20_4_ = 0;
  p2sh.super_CScriptBase._union.indirect_contents.indirect = (char *)k._0_8_;
  p2sh.super_CScriptBase._union.indirect_contents.capacity =
       (uint)k.keydata._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
  p2sh.super_CScriptBase._24_8_ = local_198;
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&sSerialized);
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x3d;
  file_07.m_begin = (iterator)&local_2d0;
  msg_07.m_end = pvVar11;
  msg_07.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2e0,
             msg_07);
  scriptSig2.super_CScriptBase._union._8_8_ =
       scriptSig2.super_CScriptBase._union._8_8_ & 0xffffffffffffff00;
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect = "@;\x1f";
  scriptSig2.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  scriptSig2.super_CScriptBase._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  uVar4 = CScript::GetSigOpCount(&p2sh,true);
  local_29c = 0;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(sSerialized_1.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,uVar4 == 0);
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_180._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_180.m_message.px = (element_type *)0xf3dfb4;
  local_190 = &local_1a0;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)sSerialized.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "@;\x1f";
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_198 = (undefined1  [8])&local_29c;
  k.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._0_4_ =
       (uint)k.keydata._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl &
       0xffffff00;
  k._0_8_ = &PTR__lazy_ostream_013abbb0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_1a0._0_4_ = uVar4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sSerialized_1,(lazy_ostream *)&scriptSig2,1,2,REQUIRE,0xf3e03f,
             (size_t)&local_180,0x3d,
             (_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)&sSerialized,"0U",&k);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x3e;
  file_08.m_begin = (iterator)&local_2f0;
  msg_08.m_end = pvVar11;
  msg_08.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_300,
             msg_08);
  scriptSig2.super_CScriptBase._union._8_8_ =
       scriptSig2.super_CScriptBase._union._8_8_ & 0xffffffffffffff00;
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect = "@;\x1f";
  scriptSig2.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  scriptSig2.super_CScriptBase._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  uVar4 = CScript::GetSigOpCount(&p2sh,false);
  local_1a0 = (undefined4 *)CONCAT44(local_1a0._4_4_,uVar4);
  local_29c = 0;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(sSerialized_1.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,uVar4 == 0);
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_180._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_180.m_message.px = (element_type *)0xf3dfb4;
  local_190 = &local_1a0;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)sSerialized.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "@;\x1f";
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_198 = (undefined1  [8])&local_29c;
  k.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._0_4_ =
       (uint)k.keydata._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl &
       0xffffff00;
  k._0_8_ = &PTR__lazy_ostream_013abbb0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sSerialized_1,(lazy_ostream *)&scriptSig2.super_CScriptBase,1,2,
             REQUIRE,0xf3e058,(size_t)&local_180,0x3e,
             (_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)&sSerialized,"0U",&k);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  scriptSig2.super_CScriptBase._union._16_8_ = 0;
  scriptSig2.super_CScriptBase._24_8_ = 0;
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  scriptSig2.super_CScriptBase._union._8_8_ = 0;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(sSerialized.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,0x51);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&scriptSig2.super_CScriptBase,(iterator)&scriptSig2.super_CScriptBase,
             (uchar *)&sSerialized);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&sSerialized,(uchar *)&dummy,
             local_a4,(allocator_type *)&k);
  b_02._M_extent._M_extent_value =
       (long)sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  b_02._M_ptr = sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  pCVar6 = CScript::operator<<(&scriptSig2,b_02);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&k,(uchar *)&dummy,local_a4,
             (allocator_type *)&sSerialized_1);
  b_03._M_extent._M_extent_value =
       CONCAT44(k.keydata._M_t.
                super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._4_4_,
                (uint)k.keydata._M_t.
                      super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl)
       - k._0_8_;
  b_03._M_ptr = (pointer)k._0_8_;
  pCVar6 = CScript::operator<<(pCVar6,b_03);
  uVar9 = &s2;
  sVar5 = s2.super_CScriptBase._size;
  if (0x1c < s2.super_CScriptBase._size) {
    uVar9 = s2.super_CScriptBase._union.indirect_contents.indirect;
    sVar5 = s2.super_CScriptBase._size - 0x1d;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&sSerialized_1,
             (const_iterator)uVar9,(uchar *)(uVar9 + (long)(int)sVar5),(allocator_type *)&local_180)
  ;
  b_04._M_extent._M_extent_value =
       (long)sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_finish -
       (long)sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
  b_04._M_ptr = sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  CScript::operator<<(pCVar6,b_04);
  if (sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)sSerialized_1.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)sSerialized_1.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (k._0_8_ != 0) {
    operator_delete((void *)k._0_8_,(long)boost::unit_test::lazy_ostream::inst - k._0_8_);
  }
  if (sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)sSerialized.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)sSerialized.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x41;
  file_09.m_begin = (iterator)&local_310;
  msg_09.m_end = pvVar11;
  msg_09.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_320,
             msg_09);
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)sSerialized_1.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "@;\x1f";
  sSerialized_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_29c = CScript::GetSigOpCount(&p2sh,&scriptSig2);
  local_1a0 = &local_344;
  local_344 = 3;
  local_180.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_29c == 3);
  local_180.m_message.px = (element_type *)0x0;
  local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_190 = (undefined4 **)0xf3df4b;
  local_188 = "";
  local_198 = (undefined1  [8])&local_29c;
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)sSerialized.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "@;\x1f";
  sSerialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  k.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._0_4_ =
       (uint)k.keydata._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl &
       0xffffff00;
  k._0_8_ = &PTR__lazy_ostream_013abbb0;
  boost::test_tools::tt_detail::report_assertion
            (&local_180,(lazy_ostream *)&sSerialized_1,1,2,REQUIRE,0xf3e072,(size_t)&local_190,0x41,
             (vector<unsigned_char,std::allocator<unsigned_char>> *)&sSerialized,"3U",&k);
  boost::detail::shared_count::~shared_count(&local_180.m_message.pn);
  if (0x1c < scriptSig2.super_CScriptBase._size) {
    free(scriptSig2.super_CScriptBase._union.indirect_contents.indirect);
    scriptSig2.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x1c < s2.super_CScriptBase._size) {
    free(s2.super_CScriptBase._union.indirect_contents.indirect);
    s2.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  if (keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (0x1c < scriptSig.super_CScriptBase._size) {
    free(scriptSig.super_CScriptBase._union.indirect_contents.indirect);
    scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x1c < p2sh.super_CScriptBase._size) {
    free(p2sh.super_CScriptBase._union.indirect_contents.indirect);
    p2sh.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x1c < s1.super_CScriptBase._size) {
    free(s1.super_CScriptBase._union.indirect_contents.indirect);
    s1.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(GetSigOpCount)
{
    // Test CScript::GetSigOpCount()
    CScript s1;
    BOOST_CHECK_EQUAL(s1.GetSigOpCount(false), 0U);
    BOOST_CHECK_EQUAL(s1.GetSigOpCount(true), 0U);

    uint160 dummy;
    s1 << OP_1 << ToByteVector(dummy) << ToByteVector(dummy) << OP_2 << OP_CHECKMULTISIG;
    BOOST_CHECK_EQUAL(s1.GetSigOpCount(true), 2U);
    s1 << OP_IF << OP_CHECKSIG << OP_ENDIF;
    BOOST_CHECK_EQUAL(s1.GetSigOpCount(true), 3U);
    BOOST_CHECK_EQUAL(s1.GetSigOpCount(false), 21U);

    CScript p2sh = GetScriptForDestination(ScriptHash(s1));
    CScript scriptSig;
    scriptSig << OP_0 << Serialize(s1);
    BOOST_CHECK_EQUAL(p2sh.GetSigOpCount(scriptSig), 3U);

    std::vector<CPubKey> keys;
    for (int i = 0; i < 3; i++)
    {
        CKey k = GenerateRandomKey();
        keys.push_back(k.GetPubKey());
    }
    CScript s2 = GetScriptForMultisig(1, keys);
    BOOST_CHECK_EQUAL(s2.GetSigOpCount(true), 3U);
    BOOST_CHECK_EQUAL(s2.GetSigOpCount(false), 20U);

    p2sh = GetScriptForDestination(ScriptHash(s2));
    BOOST_CHECK_EQUAL(p2sh.GetSigOpCount(true), 0U);
    BOOST_CHECK_EQUAL(p2sh.GetSigOpCount(false), 0U);
    CScript scriptSig2;
    scriptSig2 << OP_1 << ToByteVector(dummy) << ToByteVector(dummy) << Serialize(s2);
    BOOST_CHECK_EQUAL(p2sh.GetSigOpCount(scriptSig2), 3U);
}